

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::MergeFrom
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  int index;
  LogMessage *other_00;
  unsigned_long *__dest;
  unsigned_long *__src;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (other == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x57b);
    other_00 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_21,other_00);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (other->current_size_ != 0) {
    index = this->current_size_;
    Reserve(this,other->current_size_ + index);
    AddNAlreadyReserved(this,other->current_size_);
    __dest = Mutable(this,index);
    __src = Get(other,0);
    memcpy(__dest,__src,(long)other->current_size_ << 3);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}